

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall
ON_Font::ReadV5(ON_Font *this,ON_BinaryArchive *file,int *V5_font_index,ON_UUID *V5_font_id)

{
  byte bVar1;
  bool bVar2;
  RuntimeEnvironment RVar3;
  uchar uVar4;
  uint uVar5;
  uint uVar6;
  ON_FontList *this_00;
  wchar_t *pwVar7;
  wchar_t *windows_logfont_name_00;
  undefined1 local_260 [16];
  ON_Font *local_250;
  ON_Font *installed_font;
  ON_UUID uuid;
  ON_wString local_230;
  double obsolete_linefeed_ratio;
  undefined1 local_220 [4];
  int bItalic;
  wchar_t facename [65];
  ON__UINT16 local_108 [4];
  unsigned_short sh [64];
  ON_wString local_78;
  ON_wString corrupt_information_font_description;
  uint local_5c;
  ON__INT32 local_58;
  int i;
  int logfont_weight;
  Style font_style;
  Stretch font_stretch;
  Weight font_weight;
  ON_wString postscript_name;
  ON_wString windows_logfont_name;
  int local_38;
  int iStack_34;
  bool rc;
  int minor_version;
  int major_version;
  ON_UUID *V5_font_id_local;
  int *V5_font_index_local;
  ON_BinaryArchive *file_local;
  ON_Font *this_local;
  
  _minor_version = V5_font_id;
  V5_font_id_local = (ON_UUID *)V5_font_index;
  V5_font_index_local = (int *)file;
  file_local = (ON_BinaryArchive *)this;
  operator=(this,&Unset);
  if (V5_font_id_local != (ON_UUID *)0x0) {
    V5_font_id_local->Data1 = 0xffffffff;
  }
  if (_minor_version != (ON_UUID *)0x0) {
    _minor_version->Data1 = 0;
    _minor_version->Data2 = 0;
    _minor_version->Data3 = 0;
    _minor_version->Data4[0] = '\0';
    _minor_version->Data4[1] = '\0';
    _minor_version->Data4[2] = '\0';
    _minor_version->Data4[3] = '\0';
    _minor_version->Data4[4] = '\0';
    _minor_version->Data4[5] = '\0';
    _minor_version->Data4[6] = '\0';
    _minor_version->Data4[7] = '\0';
  }
  iStack_34 = 0;
  local_38 = 0;
  bVar2 = ON_BinaryArchive::Read3dmChunkVersion
                    ((ON_BinaryArchive *)V5_font_index_local,&stack0xffffffffffffffcc,&local_38);
  if (!bVar2) {
    operator=(this,&Default);
    this_local._7_1_ = 0;
    goto LAB_0063ad98;
  }
  bVar1 = 0;
  ON_wString::ON_wString(&postscript_name);
  ON_wString::ON_wString((ON_wString *)&logfont_weight);
  i._3_1_ = Normal;
  i._2_1_ = Unset;
  i._1_1_ = Upright;
  local_58 = 0;
  if ((iStack_34 == 1) &&
     (bVar2 = ON_BinaryArchive::ReadInt
                        ((ON_BinaryArchive *)V5_font_index_local,(ON__INT32 *)&local_5c), bVar2)) {
    if (V5_font_id_local != (ON_UUID *)0x0) {
      V5_font_id_local->Data1 = local_5c;
    }
    ON_wString::ON_wString(&local_78);
    bVar2 = ON_BinaryArchive::ReadString((ON_BinaryArchive *)V5_font_index_local,&local_78);
    if (bVar2) {
      pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_78);
      bVar2 = IsNotAppleFontName(pwVar7);
      if (!bVar2) {
        RVar3 = ON_BinaryArchive::ArchiveRuntimeEnvironment((ON_BinaryArchive *)V5_font_index_local)
        ;
        if (RVar3 == Apple) {
          ON_wString::operator=((ON_wString *)&logfont_weight,&local_78);
        }
        else {
          uVar5 = ON_BinaryArchive::ArchiveOpenNURBSVersion((ON_BinaryArchive *)V5_font_index_local)
          ;
          uVar6 = ON_VersionNumberConstruct(6,2,0x7e2,2,0x17,0);
          if (uVar6 < uVar5) {
            ON_wString::operator=((ON_wString *)&logfont_weight,&local_78);
          }
        }
      }
      bVar2 = ON_BinaryArchive::ReadShort((ON_BinaryArchive *)V5_font_index_local,0x40,local_108);
      if (bVar2) {
        for (local_5c = 0; (int)local_5c < 0x40; local_5c = local_5c + 1) {
          *(uint *)(&stack0xfffffffffffffde8 + (long)(int)local_5c * 4) =
               (uint)local_108[(int)local_5c];
        }
        facename[0x3e] = L'\0';
        ON_wString::operator=(&postscript_name,(wchar_t *)&stack0xfffffffffffffde8);
        WindowsLogfontName((ON_Font *)local_220);
        pwVar7 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_220);
        uVar4 = WindowsLogfontCharSetFromFaceName(pwVar7);
        this->m_logfont_charset = uVar4;
        ON_wString::~ON_wString((ON_wString *)local_220);
        if (local_38 < 1) goto LAB_0063ab14;
        bVar2 = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)V5_font_index_local,&local_58);
        if (bVar2) {
          if ((99 < local_58) && (local_58 < 0x3e9)) {
            i._3_1_ = WeightFromWindowsLogfontWeight(local_58);
          }
          obsolete_linefeed_ratio._4_4_ = 0;
          bVar2 = ON_BinaryArchive::ReadInt
                            ((ON_BinaryArchive *)V5_font_index_local,
                             (ON__INT32 *)((long)&obsolete_linefeed_ratio + 4));
          if (bVar2) {
            if (obsolete_linefeed_ratio._4_4_ != 0) {
              i._1_1_ = Italic;
            }
            local_230.m_s = (wchar_t *)1.6;
            bVar2 = ON_BinaryArchive::ReadDouble
                              ((ON_BinaryArchive *)V5_font_index_local,(double *)&local_230);
            if (bVar2) {
              if (1 < local_38) {
                installed_font = (ON_Font *)0;
                uuid._0_8_ = (uchar  [8])0x0;
                bVar2 = ON_BinaryArchive::ReadUuid
                                  ((ON_BinaryArchive *)V5_font_index_local,
                                   (ON_UUID *)&installed_font);
                if (!bVar2) goto LAB_0063ab1f;
                if (_minor_version != (ON_UUID *)0x0) {
                  *(ON_Font **)_minor_version = installed_font;
                  *(undefined8 *)_minor_version->Data4 = uuid._0_8_;
                }
              }
LAB_0063ab14:
              bVar1 = 1;
            }
          }
        }
      }
    }
LAB_0063ab1f:
    ON_wString::~ON_wString(&local_78);
  }
  this_00 = InstalledFontList();
  pwVar7 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&logfont_weight);
  windows_logfont_name_00 = ON_wString::operator_cast_to_wchar_t_(&postscript_name);
  local_250 = ON_FontList::FromNames
                        (this_00,pwVar7,windows_logfont_name_00,(wchar_t *)0x0,(wchar_t *)0x0,
                         i._3_1_,i._2_1_,i._1_1_,false,true);
  if (local_250 == (ON_Font *)0x0) {
    if (bVar1 == 0) {
      operator=(this,&Default);
    }
    else {
      pwVar7 = ON_wString::operator_cast_to_wchar_t_(&postscript_name);
      SetWindowsLogfontName(this,pwVar7);
      Internal_SetFontWeightTrio(this,i._3_1_,local_58,-1.23432101234321e+308,false);
      ON_wString::operator=(&this->m_loc_postscript_name,(ON_wString *)&logfont_weight);
      ON_wString::operator=(&this->m_en_postscript_name,&this->m_loc_postscript_name);
      pwVar7 = ON_wString::operator_cast_to_wchar_t_(&this->m_loc_windows_logfont_name);
      FamilyNameFromDirtyName((ON_Font *)(local_260 + 8),pwVar7);
      ON_wString::operator=(&this->m_loc_family_name,(ON_wString *)(local_260 + 8));
      ON_wString::~ON_wString((ON_wString *)(local_260 + 8));
      pwVar7 = ON_wString::operator_cast_to_wchar_t_(&this->m_en_windows_logfont_name);
      FamilyNameFromDirtyName((ON_Font *)local_260,pwVar7);
      ON_wString::operator=(&this->m_en_family_name,(ON_wString *)local_260);
      ON_wString::~ON_wString((ON_wString *)local_260);
    }
  }
  else {
    operator=(this,local_250);
  }
  this_local._7_1_ = bVar1;
  ON_wString::~ON_wString((ON_wString *)&logfont_weight);
  ON_wString::~ON_wString(&postscript_name);
LAB_0063ad98:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_Font::ReadV5(
  ON_BinaryArchive& file, // restore definition from binary archive
  int* V5_font_index,
  ON_UUID* V5_font_id
  )
{
  *this = ON_Font::Unset;

  if ( nullptr != V5_font_index )
    *V5_font_index = -1;
  if ( nullptr != V5_font_id )
    *V5_font_id = ON_nil_uuid;
  
  int major_version = 0;
  int minor_version = 0;
  if (!file.Read3dmChunkVersion(&major_version, &minor_version))
  {
    *this = ON_Font::Default;
    return false;
  }

  bool rc = false;

  ON_wString windows_logfont_name;
  ON_wString postscript_name;
  ON_Font::Weight font_weight = ON_Font::Weight::Normal;
  ON_Font::Stretch font_stretch = ON_Font::Stretch::Unset;
  ON_Font::Style font_style = ON_Font::Style::Upright;
  int logfont_weight = 0;

  for (;;)
  {
    if ( 1 != major_version )
      break;
    int i;
    if (!file.ReadInt(&i))
      break;
    if ( nullptr != V5_font_index )
      *V5_font_index = i;

    ON_wString corrupt_information_font_description;
    if (!file.ReadString(corrupt_information_font_description))
      break;

    if ( false == ON_Font::IsNotAppleFontName(corrupt_information_font_description)  )
    {
      if (ON::RuntimeEnvironment::Apple == file.ArchiveRuntimeEnvironment())
      {
        // Files written by Mac Rhino 5 for Mac have the Apple font name stored in this string.
        postscript_name = corrupt_information_font_description;
      }
      else if ( file.ArchiveOpenNURBSVersion() > ON_VersionNumberConstruct(6, 2, 2018, 2, 23, 0) )
      {
        postscript_name = corrupt_information_font_description;
      }
    }
 
    // 18 October 2002 Dale Lear:
    //   This code deals with an old bug.
    //   The Windows LOGFONT.lfFaceName was written as an array of 64 unsigned shorts.
    unsigned short sh[64];
    if (!file.ReadShort(64, sh))
      break;

    wchar_t facename[65];
    for(i = 0; i < 64; i++)
      facename[i] = sh[i];
    facename[64] = 0;
    windows_logfont_name = facename;

    m_logfont_charset = ON_Font::WindowsLogfontCharSetFromFaceName(WindowsLogfontName());
    if (minor_version >= 1)
    {
      if (!file.ReadInt(&logfont_weight))
        break;

      if (logfont_weight >= 100 && logfont_weight <= 1000)
      {
        font_weight = ON_Font::WeightFromWindowsLogfontWeight(logfont_weight);
      }

      int bItalic = 0;
      if (!file.ReadInt(&bItalic))
        break;
      if ( 0 != bItalic )
        font_style = ON_Font::Style::Italic;

      double obsolete_linefeed_ratio = ON_FontMetrics::DefaultLineFeedRatio;
      if (!file.ReadDouble(&obsolete_linefeed_ratio))
        break;

      if (minor_version >= 2)
      {
        ON_UUID uuid = ON_nil_uuid;
        if (!file.ReadUuid(uuid))
          break;
        if ( nullptr != V5_font_id )
          *V5_font_id = uuid;
      }
    }

    rc = true;
    break;
  }

  const ON_Font* installed_font = ON_Font::InstalledFontList().FromNames(
    postscript_name,
    windows_logfont_name,
    nullptr,
    nullptr,
    font_weight,
    font_stretch,
    font_style,
    false,
    true
  );

  if (nullptr != installed_font)
  {
    *this = *installed_font;
  }
  else if (rc)
  {
    SetWindowsLogfontName(windows_logfont_name);
    Internal_SetFontWeightTrio(
      font_weight,
      logfont_weight,
      ON_UNSET_VALUE,
      false
    );
    m_loc_postscript_name = postscript_name;
    m_en_postscript_name = m_loc_postscript_name;
    m_loc_family_name = ON_Font::FamilyNameFromDirtyName(m_loc_windows_logfont_name);
    m_en_family_name = ON_Font::FamilyNameFromDirtyName(m_en_windows_logfont_name);
  }
  else
  {
    *this = ON_Font::Default;
  }

  return rc;
}